

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FindObjectHelper<true,true>
              (RecyclableObject *obj,int64 length,int64 start,RecyclableObject *callBackFn,
              Var thisArg,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  uint64 uVar6;
  uint64 uVar7;
  JavascriptMethod p_Var8;
  uint index;
  ulong uVar9;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  undefined1 *local_38;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  index = (uint)length;
  do {
    index = index - 1;
    uVar9 = (ulong)index;
    if (length <= (long)uVar9) {
      local_38 = &DAT_10000ffffffff;
      break;
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar5 = JavascriptOperators::GetItem(obj,index,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if ((int)index < 0) {
      jsReentLock._24_8_ = (BADTYPE)uVar9;
      uVar6 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_);
      bVar2 = NumberUtilities::IsNan((double)jsReentLock._24_8_);
      if (((bVar2) &&
          (uVar7 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
          uVar7 != 0xfff8000000000000)) &&
         (uVar7 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
         uVar7 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      local_38 = (undefined1 *)(uVar6 ^ 0xfffc000000000000);
    }
    else {
      local_38 = (undefined1 *)(uVar9 | 0x1000000000000);
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = scriptContext->threadContext;
    bVar2 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (scriptContext->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var8 = RecyclableObject::GetEntryPoint(callBackFn);
    CheckIsExecutable(callBackFn,p_Var8);
    p_Var8 = RecyclableObject::GetEntryPoint(callBackFn);
    pvVar5 = (*p_Var8)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,pvVar5,
                       local_38,obj);
    this->reentrancySafeOrHandled = bVar2;
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    BVar3 = JavascriptConversion::ToBoolean(pvVar5,scriptContext);
  } while (BVar3 == 0);
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::FindObjectHelper(RecyclableObject* obj, int64 length, int64 start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : (uint32)start;
        int8 loopDelta = reversed ? -1 : 1;

        for (uint32 k = loopStart; k < length; k += loopDelta)
        {
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, k, scriptContext));
            Var index = JavascriptNumber::ToVar(k, scriptContext);

            JS_REENTRANT(jsReentLock,
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                            element,
                            index,
                            obj);
                }
                END_SAFE_REENTRANT_CALL
            );

            if (JavascriptConversion::ToBoolean(testResult, scriptContext))
            {
                return findIndex ? index : element;
            }
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }